

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::DescriptorKeyJson::ConvertFromStruct
          (DescriptorKeyJson *this,DescriptorKeyJsonStruct *data)

{
  DescriptorKeyJsonStruct *data_local;
  DescriptorKeyJson *this_local;
  
  std::__cxx11::string::operator=((string *)&this->key_type_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->key_,(string *)&data->key);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void DescriptorKeyJson::ConvertFromStruct(
    const DescriptorKeyJsonStruct& data) {
  key_type_ = data.key_type;
  key_ = data.key;
  ignore_items = data.ignore_items;
}